

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall
fmcalc::dofm(fmcalc *this,int event_id,vector<int,_std::allocator<int>_> *items,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *event_guls)

{
  fmcalc *this_00;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *this_01;
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer ppVar5;
  long lVar6;
  int *piVar7;
  undefined4 *puVar8;
  pointer pcVar9;
  pointer pfVar10;
  pointer pfVar11;
  pointer pvVar12;
  pointer piVar13;
  pointer pfVar14;
  pointer piVar15;
  _Base_ptr p_Var16;
  pointer pvVar17;
  bool bVar18;
  long lVar19;
  _Base_ptr p_Var20;
  uint uVar21;
  ulong uVar22;
  fmlevelrec *y;
  pointer pvVar23;
  int *piVar24;
  _Base_ptr __ptr;
  uint i;
  int iVar25;
  int iVar26;
  ulong uVar27;
  size_type sVar28;
  char *__format;
  uint uVar29;
  vector<int,_std::allocator<int>_> *this_02;
  fmcalc *this_03;
  undefined4 *puVar30;
  long lVar31;
  vector<float,_std::allocator<float>_> *gul;
  int i_1;
  long lVar32;
  int iVar33;
  long lVar34;
  float fVar35;
  size_type local_118;
  int local_10c;
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  outmap;
  int event_id_local;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  agg_vecs;
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  avxs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  aggid_to_vectorlookups;
  fmlevelrec r;
  
  event_id_local = event_id;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&aggid_to_vectorlookups,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  pvVar17 = aggid_to_vectorlookups.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar28 = (size_type)
           *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (sVar28 == 0xffffffffffffffff) {
    __format = "FATAL: Error: Possible level %d not initialized\n";
    uVar22 = 0;
LAB_001036b0:
    fprintf(_stderr,__format,uVar22);
    exit(-1);
  }
  outmap._M_t._M_impl._0_4_ = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::resize
            (aggid_to_vectorlookups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,sVar28,(value_type_conflict1 *)&outmap);
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::resize(&avxs,(long)this->maxLevel_ + 1);
  pvVar23 = avxs.
            super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (event_guls->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((event_guls->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    local_118 = 0;
  }
  else {
    std::
    vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
    ::resize(avxs.
             super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(long)this->max_layer_ + 1);
    local_10c = 0;
    uVar22 = 0;
    while (iVar25 = (int)uVar22,
          uVar22 < (ulong)((long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data._M_start >> 2)) {
      iVar26 = *(int *)(*(long *)&(((this->pfm_vec_vec_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data +
                       (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar22] * 4);
      lVar31 = (long)iVar26;
      lVar19 = (long)(pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar31 + -1];
      if (lVar19 == -2) {
        outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
        outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        outmap._M_t._M_impl._4_4_ = iVar26;
        outmap._M_t._M_impl._0_4_ =
             *(undefined4 *)
              (*(long *)(*(long *)&(((this->policy_tc_vec_vec_vec_).
                                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar31 * 0x18) + 4);
        std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                  ((pvVar23->
                   super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,(value_type *)&outmap);
        agg_vecs.
        super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar25;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&(*(pointer *)
                      ((long)&(pvVar23->
                              super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                              _M_impl.super__Vector_impl_data + 8))[-1].item_idx,(int *)&agg_vecs);
        pvVar3 = (pvVar23->
                 super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar31 + -1] =
             (int)(((long)*(pointer *)
                           ((long)&pvVar3[1].
                                   super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar3[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data) / 0x28) + -1;
        local_10c = local_10c + 1;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   &outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      }
      else {
        outmap._M_t._M_impl._0_4_ = iVar25;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   (*(long *)&(pvVar23->
                              super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                              _M_impl.super__Vector_impl_data + lVar19 * 0x28 + 0x10),(int *)&outmap
                  );
      }
      uVar22 = (ulong)(iVar25 + 1);
    }
    uVar22 = 1;
    while( true ) {
      pvVar23 = avxs.
                super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)avxs.
                         super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)avxs.
                        super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar22) break;
      this_01 = avxs.
                super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar22;
      std::
      vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
      ::resize(this_01,(long)this->max_layer_ + 1);
      sVar28 = (size_type)
               (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
      if (sVar28 == 0xffffffffffffffff) {
        __format = "FATAL:Error possible level %d not initialized\n";
        goto LAB_001036b0;
      }
      this_02 = aggid_to_vectorlookups.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar22;
      outmap._M_t._M_impl._0_4_ = 0xfffffffe;
      std::vector<int,_std::allocator<int>_>::resize(this_02,sVar28,(value_type_conflict1 *)&outmap)
      ;
      pvVar23 = pvVar23 + ((int)uVar22 - 1);
      uVar29 = 0;
      while( true ) {
        pvVar3 = (pvVar23->
                 super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar19 = *(long *)&pvVar3[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                           ._M_impl.super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar3[1].
                                    super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                    _M_impl.super__Vector_impl_data + 8) - lVar19) / 0x28) <=
            (ulong)uVar29) break;
        lVar31 = (ulong)uVar29 * 0x28;
        iVar25 = *(int *)(*(long *)&(this->pfm_vec_vec_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data +
                         (long)*(int *)(lVar19 + 4 + lVar31) * 4);
        lVar19 = (long)iVar25;
        lVar34 = (long)(this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar19 + -1];
        if (lVar34 == -2) {
          lVar34 = lVar19 * 0x18;
          for (uVar27 = 1;
              pvVar4 = (this->policy_tc_vec_vec_vec_).
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
              lVar32 = *(long *)&pvVar4[uVar22].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data,
              uVar27 < (ulong)(*(long *)(lVar32 + 8 + lVar34) - *(long *)(lVar32 + lVar34) >> 2);
              uVar27 = (ulong)((int)uVar27 + 1)) {
            outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
            outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            outmap._M_t._M_impl._4_4_ = iVar25;
            outmap._M_t._M_impl._0_4_ =
                 *(undefined4 *)
                  (*(long *)(*(long *)&pvVar4[uVar22].
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar34) + uVar27 * 4);
            std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                      ((this_01->
                       super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar27,(value_type *)&outmap);
            pvVar3 = (this_01->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            ppVar5 = *(pointer *)
                      ((long)&pvVar3[uVar27].
                              super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                              _M_impl.super__Vector_impl_data + 8);
            lVar32 = *(long *)&pvVar3[uVar27].
                               super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                               _M_impl.super__Vector_impl_data;
            lVar6 = *(long *)&(pvVar23->
                              super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                              _M_impl.super__Vector_impl_data;
            piVar7 = *(int **)(lVar6 + 0x18 + lVar31);
            for (piVar24 = *(int **)(lVar6 + 0x10 + lVar31); piVar24 != piVar7;
                piVar24 = piVar24 + 1) {
              agg_vecs.
              super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = *piVar24;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)ppVar5 +
                         (*(long *)&(this_01->
                                    super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar27].
                                    super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                    _M_impl.super__Vector_impl_data - lVar32) + -0x18),
                         (value_type_conflict1 *)&agg_vecs);
            }
            pvVar3 = (this_01->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[lVar19 + -1] =
                 (int)(((long)*(pointer *)
                               ((long)&pvVar3[uVar27].
                                       super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar3[uVar27].
                                 super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                 _M_impl.super__Vector_impl_data) / 0x28) + -1;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)
                       &outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
        }
        else {
          for (uVar27 = 1;
              lVar32 = *(long *)&(this->policy_tc_vec_vec_vec_).
                                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data,
              uVar27 < (ulong)(*(long *)(lVar32 + 8 + lVar19 * 0x18) -
                               *(long *)(lVar32 + lVar19 * 0x18) >> 2);
              uVar27 = (ulong)((int)uVar27 + 1)) {
            lVar32 = *(long *)&(pvVar23->
                               super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].
                               super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                               _M_impl.super__Vector_impl_data;
            puVar8 = *(undefined4 **)(lVar32 + 0x18 + lVar31);
            for (puVar30 = *(undefined4 **)(lVar32 + 0x10 + lVar31); puVar30 != puVar8;
                puVar30 = puVar30 + 1) {
              outmap._M_t._M_impl._0_4_ = *puVar30;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         (*(long *)&(this_01->
                                    super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar27].
                                    super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                    _M_impl.super__Vector_impl_data + lVar34 * 0x28 + 0x10),
                         (value_type_conflict1 *)&outmap);
            }
          }
        }
        uVar29 = uVar29 + 1;
      }
      uVar22 = (ulong)((int)uVar22 + 1);
    }
    local_118 = (size_type)local_10c;
  }
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::vector(&agg_vecs,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  lVar19 = 0;
  lVar31 = 0;
  while( true ) {
    this_03 = (fmcalc *)
              CONCAT44(agg_vecs.
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)agg_vecs.
                            super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    if (this->maxLevel_ < lVar31) break;
    std::
    vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
    ::resize((vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
              *)((long)&(this_03->inputpath_)._M_dataplus._M_p + lVar19),(long)this->max_layer_ + 1)
    ;
    lVar31 = lVar31 + 1;
    lVar19 = lVar19 + 0x18;
  }
  pcVar9 = (this_03->inputpath_)._M_dataplus._M_p;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outmap._M_t._M_impl.super__Rb_tree_header._M_header;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (fmcalc *)(pcVar9 + 0x18);
  uVar29 = 0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pvVar2 = (event_guls->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(event_guls->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <=
        (ulong)uVar29) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::clear(&aggid_to_vectorlookups);
      for (p_Var20 = outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var20 != &outmap._M_t._M_impl.super__Rb_tree_header;
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
        fwrite(&event_id_local,4,1,_stdout);
        fwrite(p_Var20 + 1,4,1,_stdout);
        p_Var16 = p_Var20[1]._M_left;
        for (__ptr = p_Var20[1]._M_parent; __ptr != p_Var16; __ptr = (_Base_ptr)&__ptr->_M_parent) {
          fwrite(__ptr,8,1,_stdout);
        }
        r.sidx = 0;
        r.loss = 0.0;
        fwrite(&r,8,1,_stdout);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
      ::~_Rb_tree(&outmap._M_t);
      std::
      vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
      ::~vector(&agg_vecs);
      std::
      vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
      ::~vector(&avxs);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&aggid_to_vectorlookups);
      return;
    }
    gul = pvVar2 + uVar29;
    if (uVar29 < 2) {
LAB_0010340d:
      std::vector<LossRec,_std::allocator<LossRec>_>::resize
                ((vector<LossRec,_std::allocator<LossRec>_> *)this_00,local_118);
      lVar19 = *(long *)(pcVar9 + 0x18);
      lVar31 = *(long *)(pcVar9 + 0x20);
      for (uVar21 = 0; (ulong)uVar21 < (ulong)((lVar31 - lVar19) / 0x60); uVar21 = uVar21 + 1) {
        *(undefined4 *)(lVar19 + (ulong)uVar21 * 0x60) = 0;
      }
      pfVar10 = (gul->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pfVar11 = (gul->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar12 = (this->pfm_vec_vec_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar13 = (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar18 = this->isGULStreamType_;
      pfVar14 = (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar26 = 0;
      iVar25 = -1;
      for (uVar21 = 0; uVar22 = (ulong)uVar21, uVar22 < (ulong)((long)pfVar11 - (long)pfVar10 >> 2);
          uVar21 = uVar21 + 1) {
        iVar1 = *(int *)(*(long *)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + (long)piVar13[uVar22] * 4);
        piVar15 = (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (iVar25 == iVar1) {
          iVar33 = piVar15[(long)iVar25 + -1];
        }
        else {
          iVar33 = piVar15[(long)iVar1 + -1];
          iVar25 = iVar1;
          iVar26 = iVar33;
        }
        lVar32 = (long)iVar26 * 0x60;
        *(float *)(lVar19 + lVar32) = pfVar10[uVar22] + *(float *)(lVar19 + lVar32);
        lVar34 = *(long *)&((avxs.
                             super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1].
                           super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl.
                           super__Vector_impl_data;
        lVar31 = lVar34 + (long)iVar33 * 0x28;
        *(undefined4 *)(lVar19 + 0x28 + lVar32) = *(undefined4 *)(lVar31 + 4);
        *(long *)(lVar19 + 0x38 + lVar32) = lVar31 + 0x10;
        fVar35 = 0.0;
        if ((bVar18 & 1U) != 0) {
          fVar35 = pfVar14[piVar13[uVar22]];
        }
        *(float *)(lVar32 + lVar19 + 0x18) = fVar35;
        *(undefined4 *)(lVar32 + lVar19 + 0x2c) = *(undefined4 *)(lVar34 + (long)iVar33 * 0x28);
      }
      dofmcalc_r(this,&aggid_to_vectorlookups,&agg_vecs,1,this->maxLevel_,&outmap,uVar29,&avxs,1,
                 items,event_guls,1);
      this_03 = this_00;
      std::vector<LossRec,_std::allocator<LossRec>_>::clear
                ((vector<LossRec,_std::allocator<LossRec>_> *)this_00);
    }
    else {
      bVar18 = gulhasvalue(this_03,gul);
      if (bVar18) goto LAB_0010340d;
    }
    uVar29 = uVar29 + 1;
  } while( true );
}

Assistant:

void fmcalc::dofm(int event_id, const std::vector<int> &items, std::vector<vector<OASIS_FLOAT>> &event_guls)
{
	
	const int level = 0;
	std::vector<std::vector<int>>  aggid_to_vectorlookups(maxLevel_ + 1);

	std::vector<int> &aggid_to_vectorlookup = aggid_to_vectorlookups[level];	
	int size = level_to_maxagg_id_[level];
	if (size == -1) {
		fprintf(stderr, "FATAL: Error: Possible level %d not initialized\n", level);
		exit(-1);
	}
	else {
		aggid_to_vectorlookup.resize(size, -2);
	}

	const int layer_id = 1;
	std::vector<std::vector<std::vector<policytcvidx>>> avxs;
	int total_loss_items = 0;
    avxs.resize(maxLevel_ + 1);
	if (event_guls.size() > 0) {
		auto &guls = event_guls[0];		// pick any set of events they'll all have the same size we just want the size
		std::vector<std::vector<policytcvidx>> &avx = avxs[level];

		avx.resize(max_layer_+1);
		for (unsigned int i = 0;i < guls.size();i++) {
			int agg_id = pfm_vec_vec_[level][items[i]];

			int current_idx = aggid_to_vectorlookup[agg_id-1];
			if (current_idx == -2) {
				policytcvidx a;
				a.agg_id = agg_id;
				a.policytc_id = policy_tc_vec_vec_vec_[level][agg_id][layer_id];
				avx[layer_id].push_back(a);			// populate the first layer
				avx[layer_id][avx[layer_id].size() - 1].item_idx.push_back(i);
				aggid_to_vectorlookup[agg_id-1] = (int) avx[layer_id].size() - 1;
				total_loss_items++;
			}
			else {
				avx[layer_id][current_idx].item_idx.push_back(i);
			}
			
		}
		       
		for (unsigned int zzlevel = 1;zzlevel < avxs.size();zzlevel++) {
			std::vector<std::vector<policytcvidx>>  &prev = avxs[zzlevel-1];
			std::vector<std::vector<policytcvidx>>  &next = avxs[zzlevel];
			next.resize(max_layer_ + 1);

			std::vector<int> &zzaggid_to_vectorlookup = aggid_to_vectorlookups[zzlevel]; // 
			int size = level_to_maxagg_id_[zzlevel];
			if (size == -1) {
				fprintf(stderr, "FATAL:Error possible level %d not initialized\n", zzlevel);
				exit(-1);
			}
			else {
				zzaggid_to_vectorlookup.resize(size, -2);
			}
			
			int previous_layer = 1; // previous layer is always one because only the last layer can be greater than 1

			for (unsigned int i = 0;i < prev[previous_layer].size();i++) {
				int agg_id = pfm_vec_vec_[zzlevel][prev[previous_layer][i].agg_id];
				int current_idx = zzaggid_to_vectorlookup[agg_id-1];
				if (current_idx == -2)		// field not initialized
				{

					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size() ; layer++ ){ // loop through layers
						struct policytcvidx a;
						const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];

						a.agg_id = agg_id;
						a.policytc_id = policytc_id;

						next[layer].push_back(a);
						
						size_t current_idx = next[layer].size() - 1;
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
						zzaggid_to_vectorlookup[agg_id-1] = (int) next[layer].size() - 1; // temp use for getting 
					}						
				}
				else {
					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size(); layer++) { // loop through layers
						//const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
					}

				}
			}
		}
	}

	vector<vector<vector <LossRec>>>agg_vecs(maxLevel_ + 1);
	for (int i = 0; i < maxLevel_ + 1; i++) {
		agg_vecs[i].resize(max_layer_ + 1);
	}
	vector <LossRec> &agg_vec = agg_vecs[level][layer_id];
	std::map<int, std::vector<fmlevelrec>> outmap;
	
	for (unsigned int gul_idx = 0; gul_idx < event_guls.size(); gul_idx++) {    // loop sample + 1 times
		const std::vector<OASIS_FLOAT>& guls = event_guls[gul_idx];
		if (gul_idx < 2 || gulhasvalue(guls)) {
			agg_vec.resize(total_loss_items);
			//fmlevelhdr fmhdr;
			//fmhdr.event_id = event_id;
			const std::vector<std::vector<policytcvidx>> &avx = avxs[level];
			for (unsigned int i = 0; i < agg_vec.size(); i++) agg_vec[i].loss = 0;
			int last_agg_id = -1;
			int vec_idx = 0;
			for (unsigned int i = 0; i < guls.size(); i++) {
				int agg_id = pfm_vec_vec_[level][items[i]];
				if (last_agg_id != agg_id) {
					vec_idx = aggid_to_vectorlookup[agg_id - 1];
					last_agg_id = agg_id;
				}
				agg_vec[vec_idx].loss += guls[i];
				int vid = aggid_to_vectorlookup[agg_id - 1];
				agg_vec[vec_idx].agg_id = avx[1][vid].agg_id;
				agg_vec[vec_idx].item_idx = &avx[1][vid].item_idx;
				if (isGULStreamType_ == true) {
				    agg_vec[vec_idx].accumulated_tiv = item_to_tiv_[items[i]];
				} else agg_vec[vec_idx].accumulated_tiv = 0;
				agg_vec[vec_idx].policytc_id = avx[1][vid].policytc_id;
			}
			
			dofmcalc_r(aggid_to_vectorlookups, agg_vecs, level + 1, maxLevel_, outmap, gul_idx, avxs, 1, items, event_guls,1);

			agg_vec.clear();
		}
	}
	aggid_to_vectorlookups.clear();
	// Do output
	for (const auto &x : outmap) {
		fwrite(&event_id, sizeof(event_id), 1, stdout);
		fwrite(&x.first, sizeof(x.first), 1, stdout);
		for (const auto &y : x.second) {
			fwrite(&y, sizeof(y), 1, stdout);
		}
		fmlevelrec r;
		r.sidx = 0;
		r.loss = 0;
		fwrite(&r, sizeof(r), 1, stdout); // terminate rows
	}
}